

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# json_printer.c
# Opt level: O3

void flatcc_json_printer_uint32_vector_field
               (flatcc_json_printer_t *ctx,flatcc_json_printer_table_descriptor_t *td,int id,
               char *name,size_t len)

{
  uint uVar1;
  long lVar2;
  int iVar3;
  char *pcVar4;
  uint *puVar5;
  uint32_t *puVar6;
  ulong __n;
  char *pcVar7;
  ulong uVar8;
  size_t sVar9;
  
  uVar1 = id * 2 + 4;
  if ((uVar1 < (uint)td->vsize) &&
     (uVar8 = (ulong)*(ushort *)((long)td->vtable + (ulong)uVar1), uVar8 != 0)) {
    puVar5 = (uint *)(uVar8 + (long)td->table);
    iVar3 = td->count;
    td->count = iVar3 + 1;
    if (iVar3 != 0) {
      pcVar7 = ctx->p;
      ctx->p = pcVar7 + 1;
      *pcVar7 = ',';
    }
    uVar8 = (ulong)*puVar5;
    iVar3 = *(int *)((long)puVar5 + uVar8);
    print_name(ctx,name,len);
    ctx->level = ctx->level + 1;
    pcVar7 = ctx->p;
    ctx->p = pcVar7 + 1;
    *pcVar7 = '[';
    if (iVar3 == 0) {
      pcVar7 = ctx->p;
    }
    else {
      pcVar7 = ctx->p;
      if (ctx->indent == '\0') {
        if (ctx->pflush <= pcVar7) {
          (*ctx->flush)(ctx,0);
          pcVar7 = ctx->p;
        }
      }
      else {
        ctx->p = pcVar7 + 1;
        *pcVar7 = '\n';
        __n = (ulong)ctx->indent * (long)ctx->level;
        pcVar7 = ctx->pflush;
        pcVar4 = ctx->p;
        if (pcVar7 < pcVar4 + __n) {
          if (pcVar7 <= pcVar4) {
            (*ctx->flush)(ctx,0);
            pcVar7 = ctx->pflush;
            pcVar4 = ctx->p;
          }
          sVar9 = (long)pcVar7 - (long)pcVar4;
          if (sVar9 < __n) {
            do {
              memset(pcVar4,0x20,sVar9);
              ctx->p = ctx->p + sVar9;
              __n = __n - sVar9;
              (*ctx->flush)(ctx,0);
              pcVar4 = ctx->p;
              sVar9 = (long)ctx->pflush - (long)pcVar4;
            } while (sVar9 < __n);
          }
        }
        memset(pcVar4,0x20,__n);
        pcVar7 = ctx->p + __n;
        ctx->p = pcVar7;
      }
      uVar1 = print_uint32(*(uint32_t *)((long)puVar5 + uVar8 + 4),pcVar7);
      pcVar7 = ctx->p + uVar1;
      iVar3 = iVar3 + -1;
      if (iVar3 != 0) {
        puVar6 = (uint32_t *)((long)puVar5 + uVar8 + 8);
        do {
          ctx->p = pcVar7 + 1;
          *pcVar7 = ',';
          pcVar7 = ctx->p;
          if (ctx->indent == '\0') {
            if (ctx->pflush <= pcVar7) {
              (*ctx->flush)(ctx,0);
              pcVar7 = ctx->p;
            }
          }
          else {
            ctx->p = pcVar7 + 1;
            *pcVar7 = '\n';
            uVar8 = (ulong)ctx->indent * (long)ctx->level;
            pcVar7 = ctx->pflush;
            pcVar4 = ctx->p;
            if (pcVar7 < pcVar4 + uVar8) {
              if (pcVar7 <= pcVar4) {
                (*ctx->flush)(ctx,0);
                pcVar7 = ctx->pflush;
                pcVar4 = ctx->p;
              }
              sVar9 = (long)pcVar7 - (long)pcVar4;
              if (sVar9 < uVar8) {
                do {
                  memset(pcVar4,0x20,sVar9);
                  ctx->p = ctx->p + sVar9;
                  uVar8 = uVar8 - sVar9;
                  (*ctx->flush)(ctx,0);
                  pcVar4 = ctx->p;
                  sVar9 = (long)ctx->pflush - (long)pcVar4;
                } while (sVar9 < uVar8);
              }
            }
            memset(pcVar4,0x20,uVar8);
            pcVar7 = ctx->p + uVar8;
            ctx->p = pcVar7;
          }
          iVar3 = iVar3 + -1;
          uVar1 = print_uint32(*puVar6,pcVar7);
          pcVar7 = ctx->p + uVar1;
          ctx->p = pcVar7;
          puVar6 = puVar6 + 1;
        } while (iVar3 != 0);
      }
    }
    if (ctx->indent != '\0') {
      ctx->p = pcVar7 + 1;
      *pcVar7 = '\n';
      lVar2 = (long)ctx->level + -1;
      ctx->level = (int)lVar2;
      uVar8 = (ulong)ctx->indent * lVar2;
      pcVar7 = ctx->pflush;
      pcVar4 = ctx->p;
      if (pcVar7 < pcVar4 + uVar8) {
        if (pcVar7 <= pcVar4) {
          (*ctx->flush)(ctx,0);
          pcVar7 = ctx->pflush;
          pcVar4 = ctx->p;
        }
        sVar9 = (long)pcVar7 - (long)pcVar4;
        if (sVar9 < uVar8) {
          do {
            memset(pcVar4,0x20,sVar9);
            ctx->p = ctx->p + sVar9;
            uVar8 = uVar8 - sVar9;
            (*ctx->flush)(ctx,0);
            pcVar4 = ctx->p;
            sVar9 = (long)ctx->pflush - (long)pcVar4;
          } while (sVar9 < uVar8);
        }
      }
      memset(pcVar4,0x20,uVar8);
      pcVar7 = ctx->p + uVar8;
    }
    ctx->p = pcVar7 + 1;
    *pcVar7 = ']';
  }
  return;
}

Assistant:

static inline const void *get_field_ptr(flatcc_json_printer_table_descriptor_t *td, int id)
{
    uoffset_t vo = (uoffset_t)(id + 2) * (uoffset_t)sizeof(voffset_t);

    if (vo >= (uoffset_t)td->vsize) {
        return 0;
    }
    vo = read_voffset(td->vtable, vo);
    if (vo == 0) {
        return 0;
    }
    return (uint8_t *)td->table + vo;
}